

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_file.c
# Opt level: O0

int blank(FILE *f,char *name)

{
  int __c;
  undefined8 in_RSI;
  FILE *in_RDI;
  bool bVar1;
  int c;
  
  do {
    __c = fgetc(in_RDI);
    if (__c == -1) {
      _p2sc_msg("blank",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
                ,0x171,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",0x10cc,
                "%s: unexpected end of file",in_RSI);
      exit(1);
    }
    bVar1 = true;
    if (((__c != 0x20) && (bVar1 = true, __c != 9)) && (bVar1 = true, __c != 10)) {
      bVar1 = __c == 0xd;
    }
  } while (bVar1);
  ungetc(__c,in_RDI);
  return 0;
}

Assistant:

static int blank(FILE *f, const char *name) {
    int c;

    do {
        c = fgetc(f);
        if (c == EOF) {
            P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA, "%s: unexpected end of file", name);
            return -1;
        }
    } while (c == ' ' || c == '\t' || c == '\n' || c == '\r');
    ungetc(c, f);

    return 0;
}